

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall ot::commissioner::JsonException::JsonException(JsonException *this,Error *aError)

{
  string *psVar1;
  Error *aError_local;
  JsonException *this_local;
  
  psVar1 = Error::GetMessage_abi_cxx11_(aError);
  std::invalid_argument::invalid_argument(&this->super_invalid_argument,(string *)psVar1);
  *(undefined ***)this = &PTR__JsonException_0047ea40;
  Error::Error(&this->mError,aError);
  return;
}

Assistant:

explicit JsonException(Error aError)
        : std::invalid_argument(aError.GetMessage())
        , mError(aError)
    {
    }